

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
emplace<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
          (QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>> *this,
          qsizetype i,QModelIndex *args,Mapping **args_1)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  quintptr qVar6;
  QAbstractItemModel *pQVar7;
  Mapping *pMVar8;
  long lVar9;
  
  piVar3 = *(int **)this;
  if ((piVar3 == (int *)0x0) || (1 < *piVar3)) {
LAB_0048b348:
    iVar1 = args->r;
    iVar2 = args->c;
    qVar6 = args->i;
    pQVar7 = (args->m).ptr;
    pMVar8 = *args_1;
    lVar4 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
    detachAndGrow((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                   *)this,(uint)(i == 0 && lVar4 != 0),1,
                  (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **)0x0,
                  (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                   *)0x0);
    lVar9 = *(long *)(this + 8);
    if (i != 0 || lVar4 == 0) {
      piVar3 = (int *)(lVar9 + i * 0x20);
      memmove(piVar3 + 8,(void *)(lVar9 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
      *piVar3 = iVar1;
      piVar3[1] = iVar2;
      *(quintptr *)(piVar3 + 2) = qVar6;
      *(QAbstractItemModel **)(piVar3 + 4) = pQVar7;
      *(Mapping **)(piVar3 + 6) = pMVar8;
      goto LAB_0048b40d;
    }
    *(int *)(lVar9 + -0x20) = iVar1;
    *(int *)(lVar9 + -0x1c) = iVar2;
    *(quintptr *)(lVar9 + -0x18) = qVar6;
    *(QAbstractItemModel **)(lVar9 + -0x10) = pQVar7;
    *(Mapping **)(lVar9 + -8) = pMVar8;
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar4 = *(long *)(this + 8),
       *(long *)(piVar3 + 2) !=
       ((long)(lVar4 - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      lVar9 = i * 0x20;
      *(QAbstractItemModel **)(lVar4 + 0x10 + lVar9) = (args->m).ptr;
      qVar6 = args->i;
      *(undefined8 *)(lVar4 + lVar9) = *(undefined8 *)args;
      ((undefined8 *)(lVar4 + lVar9))[1] = qVar6;
      *(Mapping **)(lVar4 + 0x18 + lVar9) = *args_1;
      goto LAB_0048b40d;
    }
    if ((i != 0) ||
       (uVar5 = *(ulong *)(this + 8), ((long)piVar3 + 0x1fU & 0xfffffffffffffff0) == uVar5))
    goto LAB_0048b348;
    *(QAbstractItemModel **)(uVar5 - 0x10) = (args->m).ptr;
    qVar6 = args->i;
    *(undefined8 *)(uVar5 - 0x20) = *(undefined8 *)args;
    *(quintptr *)(uVar5 - 0x18) = qVar6;
    *(Mapping **)(uVar5 - 8) = *args_1;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
LAB_0048b40d:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }